

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void ws_listener_stop(void *arg)

{
  nni_http_server *s;
  nni_http_handler *h;
  int iVar1;
  
  ws_listener_close(arg);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  while( true ) {
    iVar1 = nni_list_empty((nni_list *)((long)arg + 0xd8));
    if (iVar1 != 0) break;
    nni_cv_wait((nni_cv *)((long)arg + 0x88));
  }
  s = *(nni_http_server **)((long)arg + 0x50);
  h = *(nni_http_handler **)((long)arg + 0x118);
  *(undefined8 *)((long)arg + 0x118) = 0;
  *(undefined8 *)((long)arg + 0x50) = 0;
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  if (h != (nni_http_handler *)0x0) {
    nni_http_handler_fini(h);
  }
  if (s != (nni_http_server *)0x0) {
    nni_http_server_fini(s);
    return;
  }
  return;
}

Assistant:

static void
ws_listener_stop(void *arg)
{
	nni_ws_listener  *l = arg;
	nni_http_handler *h;
	nni_http_server  *s;

	ws_listener_close(l);

	nni_mtx_lock(&l->mtx);
	while (!nni_list_empty(&l->reply)) {
		nni_cv_wait(&l->cv);
	}
	h          = l->handler;
	s          = l->server;
	l->handler = NULL;
	l->server  = NULL;
	nni_mtx_unlock(&l->mtx);

	if (h != NULL) {
		nni_http_handler_fini(h);
	}
	if (s != NULL) {
		nni_http_server_fini(s);
	}
}